

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeCheckFk(Vdbe *p,int deferred)

{
  sqlite3 *db;
  int deferred_local;
  Vdbe *p_local;
  
  if (((deferred == 0) || (p->db->nDeferredCons + p->db->nDeferredImmCons < 1)) &&
     ((deferred != 0 || (p->nFkConstraint < 1)))) {
    p_local._4_4_ = 0;
  }
  else {
    p->rc = 0x313;
    p->errorAction = '\x02';
    sqlite3VdbeError(p,"FOREIGN KEY constraint failed");
    if ((p->prepFlags & 0x80) == 0) {
      p_local._4_4_ = 1;
    }
    else {
      p_local._4_4_ = 0x313;
    }
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCheckFk(Vdbe *p, int deferred){
  sqlite3 *db = p->db;
  if( (deferred && (db->nDeferredCons+db->nDeferredImmCons)>0)
   || (!deferred && p->nFkConstraint>0)
  ){
    p->rc = SQLITE_CONSTRAINT_FOREIGNKEY;
    p->errorAction = OE_Abort;
    sqlite3VdbeError(p, "FOREIGN KEY constraint failed");
    if( (p->prepFlags & SQLITE_PREPARE_SAVESQL)==0 ) return SQLITE_ERROR;
    return SQLITE_CONSTRAINT_FOREIGNKEY;
  }
  return SQLITE_OK;
}